

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::delete_socket(dht_tracker *this,listen_socket_handle *s)

{
  dht_observer *pdVar1;
  uint uVar2;
  undefined8 uVar3;
  string local_78;
  endpoint local_54;
  undefined1 local_38 [8];
  address local_address;
  listen_socket_handle *s_local;
  dht_tracker *this_local;
  
  local_address.ipv6_address_.scope_id_ = (unsigned_long)s;
  uVar2 = (**(this->m_log->super_dht_logger)._vptr_dht_logger)(this->m_log,0);
  if ((uVar2 & 1) != 0) {
    libtorrent::aux::listen_socket_handle::get_local_endpoint
              (&local_54,(listen_socket_handle *)local_address.ipv6_address_.scope_id_);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address((address *)local_38,&local_54);
    pdVar1 = this->m_log;
    boost::asio::ip::address::to_string_abi_cxx11_(&local_78,(address *)local_38);
    uVar3 = ::std::__cxx11::string::c_str();
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])(pdVar1,0,"removing DHT node on %s",uVar3);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  ::std::
  map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
  ::erase(&this->m_nodes,(key_type *)local_address.ipv6_address_.scope_id_);
  update_storage_node_ids(this);
  return;
}

Assistant:

void dht_tracker::delete_socket(aux::listen_socket_handle const& s)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (m_log->should_log(dht_logger::tracker))
		{
			address const local_address = s.get_local_endpoint().address();
			m_log->log(dht_logger::tracker, "removing DHT node on %s"
				, local_address.to_string().c_str());
		}
#endif
		m_nodes.erase(s);

		update_storage_node_ids();
	}